

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
ptc::(anonymous_namespace)::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *os,
          duration<long,_std::ratio<1L,_1000000L>_> *val)

{
  int iVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  undefined1 local_14b;
  undefined1 local_14a;
  undefined1 local_149;
  long *local_148;
  undefined8 local_140;
  long local_138 [2];
  long *local_128;
  undefined8 local_120;
  long local_118 [2];
  long *local_108;
  undefined8 local_100;
  long local_f8 [2];
  long *local_e8;
  undefined8 local_e0;
  long local_d8 [2];
  long *local_c8;
  undefined8 local_c0;
  long local_b8 [2];
  key_type local_a8;
  undefined8 local_a0;
  long *local_98;
  pointer_____offset_0x10___ *local_90;
  undefined8 local_88;
  long *local_80;
  pointer_____offset_0x10___ *local_78;
  undefined8 local_70;
  long *local_68;
  pointer_____offset_0x10___ *local_60;
  undefined8 local_58;
  long *local_50;
  pointer_____offset_0x10___ *local_48;
  undefined8 local_40;
  long *local_38;
  
  if (operator<<<char,std::
      ratio<1l,1000000l>,long>(std::ostream&,std::chrono::duration<long,std::ratio<long,long>>const&)
      ::time_map == '\0') {
    iVar1 = __cxa_guard_acquire(&operator<<<char,std::
                                 ratio<1l,1000000l>,long>(std::ostream&,std::chrono::duration<long,std::ratio<long,long>>const&)
                                 ::time_map);
    if (iVar1 != 0) {
      local_148 = local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"ns","");
      local_a8._M_target = (type_info *)&std::ratio<1l,1000000000l>::typeinfo;
      local_a0 = local_140;
      local_98 = local_148;
      local_c8 = local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"us","");
      local_90 = &std::ratio<1l,1000000l>::typeinfo;
      local_88 = local_c0;
      local_80 = local_c8;
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ms","");
      local_78 = &std::ratio<1l,1000l>::typeinfo;
      local_70 = local_e0;
      local_68 = local_e8;
      local_108 = local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"min","");
      local_60 = &std::ratio<60l,1l>::typeinfo;
      local_58 = local_100;
      local_50 = local_108;
      local_128 = local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"h","");
      local_48 = &std::ratio<3600l,1l>::typeinfo;
      local_40 = local_120;
      local_38 = local_128;
      std::
      _Hashtable<std::type_index,std::pair<std::type_index_const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::type_index_const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::type_index>,std::hash<std::type_index>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _Hashtable<std::pair<std::type_index_const,std::basic_string_view<char,std::char_traits<char>>>const*>
                ((_Hashtable<std::type_index,std::pair<std::type_index_const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::type_index_const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::type_index>,std::hash<std::type_index>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&anon_unknown_8::operator<<<char,_std::ratio<1L,_1000000L>,_long>::time_map,
                 &local_a8,&stack0xffffffffffffffd0,0,&local_149,&local_14a,&local_14b);
      if (local_128 != local_118) {
        operator_delete(local_128,local_118[0] + 1);
      }
      if (local_108 != local_f8) {
        operator_delete(local_108,local_f8[0] + 1);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8,local_d8[0] + 1);
      }
      if (local_c8 != local_b8) {
        operator_delete(local_c8,local_b8[0] + 1);
      }
      if (local_148 != local_138) {
        operator_delete(local_148,local_138[0] + 1);
      }
      __cxa_atexit(std::
                   unordered_map<std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   ::~unordered_map,
                   &anon_unknown_8::operator<<<char,_std::ratio<1L,_1000000L>,_long>::time_map,
                   &__dso_handle);
      __cxa_guard_release(&operator<<<char,std::
                           ratio<1l,1000000l>,long>(std::ostream&,std::chrono::duration<long,std::ratio<long,long>>const&)
                           ::time_map);
    }
  }
  poVar2 = std::ostream::_M_insert<long>((long)os);
  local_a8._M_target = (type_info *)&std::ratio<1l,1000000l>::typeinfo;
  pmVar3 = std::__detail::
           _Map_base<std::type_index,_std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::type_index,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&anon_unknown_8::operator<<<char,_std::ratio<1L,_1000000L>,_long>::
                            time_map,&local_a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pmVar3->_M_str,pmVar3->_M_len);
  return os;
}

Assistant:

std::basic_ostream<T_str>& operator <<( std::basic_ostream<T_str>& os, const std::chrono::duration<int_type, T_time>& val )
     {
      if constexpr( ! std::is_same_v<std::chrono::duration<int_type, T_time>, std::chrono::duration<int_type>> )
       {
        static std::unordered_map<std::type_index, std::basic_string_view<T_str>> time_map
         {
          { typeid( std::nano ), StringConverter<T_str>( "ns" ) },
          { typeid( std::micro ), StringConverter<T_str>( "us" ) },
          { typeid( std::milli ), StringConverter<T_str>( "ms" ) },
          { typeid( std::ratio<60> ), StringConverter<T_str>( "min" ) },
          { typeid( std::ratio<3600> ), StringConverter<T_str>( "h" ) }
         };
  
        #if ( __cplusplus >= 202002L )
        time_map.insert( { typeid( std::ratio<86400> ), StringConverter<T_str>( "d" ) } );
        time_map.insert( { typeid( std::ratio<604800> ), StringConverter<T_str>( "w" ) } );
        time_map.insert( { typeid( std::ratio<2629746> ), StringConverter<T_str>( "mos" ) } );
        time_map.insert( { typeid( std::ratio<31556952> ), StringConverter<T_str>( "y" ) } );
        #endif
         
        os << val.count() << time_map[ typeid( T_time ) ];
       }
      else if constexpr( std::is_same_v<std::chrono::duration<int_type, T_time>, std::chrono::duration<int_type>> )
       {
        os << val.count() << 's';
       }
  
      return os;
     }